

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
Operations::DoActualRegen
          (Operations *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool dryRun)

{
  pointer pbVar1;
  int iVar2;
  char *pcVar3;
  iterator iVar4;
  mapped_type *ppCVar5;
  ostream *poVar6;
  _Hash_node_base *p_Var7;
  pointer pbVar8;
  string target;
  string local_50;
  
  LoadProject(this,false);
  boost::filesystem::detail::current_path(&this->projectRoot,(error_code *)0x0);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar8 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    for (p_Var7 = (this->components)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
        p_Var7 = p_Var7->_M_nxt) {
      RegenerateCmakeFilesForComponent(&this->config,(Component *)p_Var7[5]._M_nxt,dryRun,false);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)pbVar8);
    if (iVar2 == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(args,(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
      dryRun = true;
    }
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 != pbVar1) {
      do {
        targetFrom(&local_50,pbVar8);
        if (this->recursive == true) {
          for (p_Var7 = (this->components)._M_h._M_before_begin._M_nxt;
              p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
            pcVar3 = strstr((char *)p_Var7[1]._M_nxt,local_50._M_dataplus._M_p);
            if (pcVar3 != (char *)0x0) {
              RegenerateCmakeFilesForComponent
                        (&this->config,(Component *)p_Var7[5]._M_nxt,dryRun,iVar2 == 0);
            }
          }
        }
        else {
          iVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->components)._M_h,&local_50);
          if (iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Target \'",8);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                                local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' not found\n",0xc);
          }
          else {
            ppCVar5 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->components,&local_50);
            RegenerateCmakeFilesForComponent(&this->config,*ppCVar5,dryRun,iVar2 == 0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar1);
    }
  }
  return;
}

Assistant:

void DoActualRegen(std::vector<std::string> args, bool dryRun) {
        LoadProject();
        filesystem::current_path(projectRoot);
        if (args.empty()) {
            for (auto &c : components) {
                RegenerateCmakeFilesForComponent(config, c.second, dryRun, false);
            }
        } else {
            bool writeToStdoutInstead = false;
            if (args[0] == "-") {
                dryRun = true; // Can't rewrite actual CMakeFiles if you asked them to be sent to stdout.
                writeToStdoutInstead = true;
                args.erase(args.begin());
            }
            for (auto& s : args) {
                const std::string target = targetFrom(s);
                if (recursive) {
                    for (auto& c : components) {
                        if (strstr(c.first.c_str(), target.c_str())) {
                            RegenerateCmakeFilesForComponent(config, c.second, dryRun, writeToStdoutInstead);
                        }
                    }
                } else {
                    if (components.find(target) != components.end()) {
                        RegenerateCmakeFilesForComponent(config, components[target], dryRun, writeToStdoutInstead);
                    } else {
                        std::cout << "Target '" << target << "' not found\n";
                    }
                }
            }
        }
    }